

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Lms_GiaProfilesPrint(Gia_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  Vec_Str_t *__ptr_00;
  Vec_Int_t *pVVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  __ptr = Lms_GiaDelays(p);
  __ptr_00 = Lms_GiaAreas(p);
  pVVar1 = p->vCos;
  uVar2 = (ulong)(uint)pVVar1->nSize;
  if (p->nRegs < pVVar1->nSize) {
    uVar3 = 0;
    do {
      if ((long)(int)uVar2 <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pVVar1->pArray[uVar3] < 0) || (p->nObjs <= pVVar1->pArray[uVar3])) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      printf("%6d : ",uVar3 & 0xffffffff);
      if ((long)__ptr_00->nSize <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      printf("A = %2d  ",(ulong)(uint)(int)__ptr_00->pArray[uVar3]);
      if ((long)__ptr->nSize <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      uVar2 = __ptr->pArray[uVar3];
      uVar5 = p->vCis->nSize - p->nRegs;
      printf("Delay profile = {");
      if (0 < (int)uVar5) {
        lVar4 = 0;
        do {
          if (lVar4 == 0x40) {
            __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x71,"int Lms_DelayGet(word, int)");
          }
          printf(" %d",(ulong)((uint)(uVar2 >> ((byte)lVar4 & 0x3f)) & 0xf));
          lVar4 = lVar4 + 4;
        } while ((ulong)uVar5 << 2 != lVar4);
      }
      puts(" }");
      uVar3 = uVar3 + 1;
      pVVar1 = p->vCos;
      uVar2 = (ulong)pVVar1->nSize;
    } while ((long)uVar3 < (long)(uVar2 - (long)p->nRegs));
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  if (__ptr_00->pArray != (char *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (char *)0x0;
  }
  if (__ptr_00 != (Vec_Str_t *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Lms_GiaProfilesPrint( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_Wrd_t * vDelays;
    Vec_Str_t * vAreas;
    vDelays = Lms_GiaDelays( p );
    vAreas = Lms_GiaAreas( p );
    Gia_ManForEachPo( p, pObj, i )
    {
        printf( "%6d : ", i );
        printf( "A = %2d  ", Vec_StrEntry(vAreas, i) );
        Lms_DelayPrint( Vec_WrdEntry(vDelays, i), Gia_ManPiNum(p) );
//        Lms_GiaPrintSubgraph( p, pObj );
//        printf( "\n" );
    }
    Vec_WrdFree( vDelays );
    Vec_StrFree( vAreas );
}